

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O0

void __thiscall
boost::python::
class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
::
def_maybe_overloads<HFSubConsumer*(PythonModuleClient::*)(std::__cxx11::string,std::__cxx11::string),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
          (class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
           *this,char *name,first_type fn,
          return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
          *a1,...)

{
  type *ptVar1;
  def_helper<boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  *in_RCX;
  first_type in_RDX;
  char *in_RSI;
  class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  *in_RDI;
  return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
  *in_stack_ffffffffffffff28;
  undefined1 local_88 [48];
  
  ptVar1 = detail::unwrap_wrapper<PythonModuleClient>((PythonModuleClient *)0x0);
  detail::
  def_helper<boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::def_helper(in_RCX,in_stack_ffffffffffffff28);
  def_impl<AbstractModuleClient,HFSubConsumer*(PythonModuleClient::*)(std::__cxx11::string,std::__cxx11::string),boost::python::detail::def_helper<boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (in_RDI,ptVar1,in_RSI,in_RDX,in_RCX,local_88,&stack0xffffffffffffffd0);
  return;
}

Assistant:

void def_maybe_overloads(
        char const* name
        , Fn fn
        , A1 const& a1
        , ...)
    {
        this->def_impl(
            detail::unwrap_wrapper((W*)0)
          , name
          , fn
          , detail::def_helper<A1>(a1)
          , &fn
        );

    }